

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void sse::Threshold(uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *outY,
                   uint8_t *outYEnd,uint8_t threshold,uint32_t simdWidth,uint32_t totalSimdWidth,
                   uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint8_t *puVar3;
  undefined3 in_register_00000089;
  uint8_t *puVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  
  if (CONCAT31(in_register_00000089,threshold) == 0) {
    for (; outY != outYEnd; outY = outY + rowSizeOut) {
      memset(outY,0xff,(ulong)(nonSimdWidth + totalSimdWidth));
    }
  }
  else {
    auVar7[8] = 0x80;
    auVar7._0_8_ = 0x8080808080808080;
    auVar7[9] = 0x80;
    auVar7[10] = 0x80;
    auVar7[0xb] = 0x80;
    auVar7[0xc] = 0x80;
    auVar7[0xd] = 0x80;
    auVar7[0xe] = 0x80;
    auVar7[0xf] = 0x80;
    puVar4 = inY + totalSimdWidth;
    puVar3 = outY + totalSimdWidth;
    auVar2 = vpbroadcastb_avx512vl();
    for (; outY != outYEnd; outY = outY + rowSizeOut) {
      for (lVar5 = 0; (ulong)simdWidth << 4 != lVar5; lVar5 = lVar5 + 0x10) {
        auVar1 = vpcmpgtb_avx(auVar7 ^ *(undefined1 (*) [16])(inY + lVar5),auVar2);
        *(undefined1 (*) [16])(outY + lVar5) = auVar1;
      }
      if (nonSimdWidth != 0) {
        for (uVar6 = 0; nonSimdWidth != uVar6; uVar6 = uVar6 + 1) {
          puVar3[uVar6] = (puVar4[uVar6] < threshold) + 0xff;
        }
      }
      inY = inY + rowSizeIn;
      puVar4 = puVar4 + rowSizeIn;
      puVar3 = puVar3 + rowSizeOut;
    }
  }
  return;
}

Assistant:

void Threshold( uint32_t rowSizeIn, uint32_t rowSizeOut, const uint8_t * inY, uint8_t * outY, const uint8_t * outYEnd, uint8_t threshold,
                    uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        // SSE does not have command "great or equal to" so we have 2 situations:
        // when threshold value is 0 and it is not
        if( threshold > 0 ) {
            const char maskValue = static_cast<char>(0x80u);
            const simd mask = _mm_set_epi8( maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
                                            maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue );

            const char compareValue = static_cast<char>((threshold - 1) ^ 0x80u);
            const simd compare = _mm_set_epi8(
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue );

            for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
                const simd * src1 = reinterpret_cast <const simd*> (inY);
                simd       * dst  = reinterpret_cast <simd*> (outY);

                const simd * src1End = src1 + simdWidth;

                for( ; src1 != src1End; ++src1, ++dst )
                    _mm_storeu_si128( dst, _mm_cmpgt_epi8( _mm_xor_si128( _mm_loadu_si128( src1 ), mask ), compare ) );

                if( nonSimdWidth > 0 ) {
                    const uint8_t * inX  = inY  + totalSimdWidth;
                    uint8_t       * outX = outY + totalSimdWidth;

                    const uint8_t * outXEnd = outX + nonSimdWidth;

                    for( ; outX != outXEnd; ++outX, ++inX )
                        (*outX) = (*inX) < threshold ? 0 : 255;
                }
            }
        }
        else {
            for( ; outY != outYEnd; outY += rowSizeOut )
                memset( outY, 255u, sizeof( uint8_t ) * (totalSimdWidth + nonSimdWidth) );
        }
    }